

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O2

string * format_system_error_abi_cxx11_
                   (string *__return_storage_ptr__,int error_code,StringRef message)

{
  undefined4 in_register_00000034;
  size_t in_R8;
  StringRef message_00;
  MemoryWriter out;
  BasicMemoryWriter<char,_std::allocator<char>_> local_238;
  
  message_00.data_ = (char *)message.size_;
  local_238.super_BasicWriter<char>.buffer_ = &local_238.buffer_.super_Buffer<char>;
  local_238.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_002b01a0;
  local_238.buffer_.super_Buffer<char>.ptr_ = local_238.buffer_.data_;
  local_238.buffer_.super_Buffer<char>.size_ = 0;
  local_238.buffer_.super_Buffer<char>.capacity_ = 500;
  local_238.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002b01e8;
  message_00.size_ = in_R8;
  fmt::internal::format_system_error
            ((internal *)&local_238,(Writer *)CONCAT44(in_register_00000034,error_code),
             (int)message.data_,message_00);
  fmt::BasicWriter<char>::str_abi_cxx11_(__return_storage_ptr__,&local_238.super_BasicWriter<char>);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&local_238);
  return __return_storage_ptr__;
}

Assistant:

std::string format_system_error(int error_code, fmt::StringRef message) {
  fmt::MemoryWriter out;
  fmt::internal::format_system_error(out, error_code, message);
  return out.str();
}